

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

bool tinyusdz::tydra::InferColorSpace(token *tok,ColorSpace *cty)

{
  int iVar1;
  ColorSpace CVar2;
  
  if (cty == (ColorSpace *)0x0) {
    return false;
  }
  iVar1 = ::std::__cxx11::string::compare((char *)tok);
  CVar2 = Raw;
  if ((iVar1 != 0) && (iVar1 = ::std::__cxx11::string::compare((char *)tok), iVar1 != 0)) {
    iVar1 = ::std::__cxx11::string::compare((char *)tok);
    CVar2 = sRGB;
    if ((iVar1 != 0) && (iVar1 = ::std::__cxx11::string::compare((char *)tok), iVar1 != 0)) {
      iVar1 = ::std::__cxx11::string::compare((char *)tok);
      CVar2 = Lin_sRGB;
      if ((iVar1 != 0) && (iVar1 = ::std::__cxx11::string::compare((char *)tok), iVar1 != 0)) {
        iVar1 = ::std::__cxx11::string::compare((char *)tok);
        if (iVar1 == 0) {
          CVar2 = Rec709;
        }
        else {
          iVar1 = ::std::__cxx11::string::compare((char *)tok);
          if (iVar1 == 0) {
            CVar2 = OCIO;
          }
          else {
            iVar1 = ::std::__cxx11::string::compare((char *)tok);
            if (iVar1 == 0) {
              CVar2 = Lin_DisplayP3;
            }
            else {
              iVar1 = ::std::__cxx11::string::compare((char *)tok);
              CVar2 = sRGB_DisplayP3;
              if (iVar1 != 0) {
                iVar1 = ::std::__cxx11::string::compare((char *)tok);
                if (iVar1 == 0) {
                  CVar2 = Lin_ACEScg;
                }
                else {
                  iVar1 = ::std::__cxx11::string::compare((char *)tok);
                  if (iVar1 != 0) {
                    iVar1 = ::std::__cxx11::string::compare((char *)tok);
                    CVar2 = sRGB;
                    if (iVar1 != 0) {
                      iVar1 = ::std::__cxx11::string::compare((char *)tok);
                      if (iVar1 != 0) {
                        return false;
                      }
                      CVar2 = Custom;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  *cty = CVar2;
  return true;
}

Assistant:

bool InferColorSpace(const value::token &tok, ColorSpace *cty) {
  if (!cty) {
    return false;
  }

  if (tok.str() == "raw") {
    (*cty) = ColorSpace::Raw;
  } else if (tok.str() == "Raw") {
    (*cty) = ColorSpace::Raw;
  } else if (tok.str() == "srgb") {
    (*cty) = ColorSpace::sRGB;
  } else if (tok.str() == "sRGB") {
    (*cty) = ColorSpace::sRGB;
  } else if (tok.str() == "linear") { // guess linear_srgb
    (*cty) = ColorSpace::Lin_sRGB;
  } else if (tok.str() == "lin_srgb") {
    (*cty) = ColorSpace::Lin_sRGB;
  } else if (tok.str() == "rec709") {
    (*cty) = ColorSpace::Rec709;
  } else if (tok.str() == "ocio") {
    (*cty) = ColorSpace::OCIO;
  } else if (tok.str() == "lin_displayp3") {
    (*cty) = ColorSpace::Lin_DisplayP3;
  } else if (tok.str() == "srgb_displayp3") {
    (*cty) = ColorSpace::sRGB_DisplayP3;

    //
    // seen in Apple's USDZ model(or OCIO?)
    //

  } else if (tok.str() == "ACES - ACEScg") {
    (*cty) = ColorSpace::Lin_ACEScg;
  } else if (tok.str() == "Input - Texture - sRGB - Display P3") {
    (*cty) = ColorSpace::sRGB_DisplayP3;
  } else if (tok.str() == "Input - Texture - sRGB - sRGB") {
    (*cty) = ColorSpace::sRGB;
  } else if (tok.str() == "custom") {
    (*cty) = ColorSpace::Custom;
  } else {
    return false;
  }

  return true;
}